

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O3

objc_slot2 * objc_slot_lookup_super2(objc_super *super,SEL selector)

{
  uint uVar1;
  Class object;
  objc_slot2 *poVar2;
  _InitializingDtable *p_Var3;
  uintptr_t addr;
  dtable_t pSVar4;
  dtable_t pSVar5;
  
  pSVar5 = uninstalled_dtable;
  if (super->receiver == (id)0x0) {
    return (objc_slot2 *)&nil_slot;
  }
  object = super->class;
  pSVar4 = (dtable_t)object->dtable;
  if (uninstalled_dtable == (dtable_t)object->dtable) {
    pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
    pSVar4 = (dtable_t)object->dtable;
    p_Var3 = temporary_dtables;
    if (uninstalled_dtable != pSVar4) {
      pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
      uVar1 = pSVar4->shift;
      poVar2 = (objc_slot2 *)
               (*(code *)(&DAT_00120b70 +
                         *(int *)(&DAT_00120b70 + (ulong)(uVar1 << 0x1d | uVar1 >> 3) * 4)))();
      return poVar2;
    }
    for (; p_Var3 != (InitializingDtable *)0x0; p_Var3 = p_Var3->next) {
      if (p_Var3->class == object) {
        pSVar5 = p_Var3->dtable;
        break;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
    pSVar4 = pSVar5;
    if (pSVar5 != uninstalled_dtable) {
      objc_sync_enter((id_conflict)object);
      objc_sync_exit((id_conflict)object);
    }
  }
  poVar2 = (objc_slot2 *)
           (*(code *)(&DAT_00120b70 +
                     *(int *)(&DAT_00120b70 +
                             (ulong)(pSVar4->shift << 0x1d | pSVar4->shift >> 3) * 4)))();
  return poVar2;
}

Assistant:

struct objc_slot2 *objc_slot_lookup_super2(struct objc_super *super, SEL selector)
{
	id receiver = super->receiver;
	if (receiver)
	{
		Class class = super->class;
		struct objc_slot2 * result = objc_dtable_lookup(dtable_for_class(class),
				selector->index);
		if (0 == result)
		{
			Class class = classForObject(receiver);
			// Dtable should always be installed in the superclass in
			// Objective-C, but may not be for other languages (Python).
			if (dtable_for_class(class) == uninstalled_dtable)
			{
				if (class_isMetaClass(class))
				{
					objc_send_initialize(receiver);
				}
				else
				{
					objc_send_initialize((id)class);
				}
				objc_send_initialize((id)class);
				return objc_slot_lookup_super2(super, selector);
			}
			uncacheable_slot.imp = __objc_msg_forward2(receiver, selector);
			return (struct objc_slot2*)&uncacheable_slot;
		}
		return result;
	}
	return (struct objc_slot2*)&nil_slot;
}